

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void reallymarkobject(global_State *g,GCObject *o)

{
  lu_byte lVar1;
  bool bVar2;
  byte bVar3;
  GCObject *pGVar4;
  Udata *iu;
  
  do {
    bVar3 = o->marked & 0xfc;
    o->marked = bVar3;
    lVar1 = o->tt;
    if (lVar1 != '\a') {
      switch(lVar1) {
      case '\x04':
        o->marked = bVar3 | 4;
        pGVar4 = (GCObject *)(ulong)(byte)o->field_0xb;
LAB_0011461b:
        g->GCmemtrav = (lu_mem)(&pGVar4[1].marked + g->GCmemtrav);
        return;
      case '\x05':
        o[3].next = g->gray;
        break;
      case '\a':
        return;
      case '\b':
        *(GCObject **)&o[4].tt = g->gray;
        break;
      case '\t':
        o[7].next = g->gray;
        break;
      default:
        if (lVar1 == '\x14') {
          o->marked = bVar3 | 4;
          pGVar4 = o[1].next;
          goto LAB_0011461b;
        }
        if (lVar1 != '&') {
          return;
        }
      case '\x06':
        o[1].next = g->gray;
      }
      g->gray = o;
      return;
    }
    pGVar4 = o[1].next;
    if ((pGVar4 != (GCObject *)0x0) && ((pGVar4->marked & 3) != 0)) {
      reallymarkobject(g,pGVar4);
    }
    o->marked = o->marked | 4;
    g->GCmemtrav = *(long *)&o[1].tt + g->GCmemtrav + 0x28;
    if ((o->field_0xa & 0x40) == 0) {
LAB_001145a8:
      bVar2 = false;
      pGVar4 = o;
    }
    else {
      bVar2 = true;
      pGVar4 = o[2].next;
      if (((o[2].next)->marked & 3) == 0) goto LAB_001145a8;
    }
    o = pGVar4;
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
 reentry:
  white2gray(o);
  switch (o->tt) {
    case LUA_TSHRSTR: {
      gray2black(o);
      g->GCmemtrav += sizelstring(gco2ts(o)->shrlen);
      break;
    }
    case LUA_TLNGSTR: {
      gray2black(o);
      g->GCmemtrav += sizelstring(gco2ts(o)->u.lnglen);
      break;
    }
    case LUA_TUSERDATA: {
      TValue uvalue;
      markobjectN(g, gco2u(o)->metatable);  /* mark its metatable */
      gray2black(o);
      g->GCmemtrav += sizeudata(gco2u(o));
      getuservalue(g->mainthread, gco2u(o), &uvalue);
      if (valiswhite(&uvalue)) {  /* markvalue(g, &uvalue); */
        o = gcvalue(&uvalue);
        goto reentry;
      }
      break;
    }
    case LUA_TLCL: {
      linkgclist(gco2lcl(o), g->gray);
      break;
    }
    case LUA_TCCL: {
      linkgclist(gco2ccl(o), g->gray);
      break;
    }
    case LUA_TTABLE: {
      linkgclist(gco2t(o), g->gray);
      break;
    }
    case LUA_TTHREAD: {
      linkgclist(gco2th(o), g->gray);
      break;
    }
    case LUA_TPROTO: {
      linkgclist(gco2p(o), g->gray);
      break;
    }
    default: lua_assert(0); break;
  }
}